

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirWatcherGeneric.cpp
# Opt level: O3

void __thiscall efsw::DirWatcherGeneric::resetDirectory(DirWatcherGeneric *this,string *directory)

{
  char cVar1;
  pointer pcVar2;
  size_t __n;
  size_t sVar3;
  char cVar4;
  int iVar5;
  DirWatcherGeneric *pDVar6;
  long lVar7;
  string dir;
  string parentPath;
  undefined1 *local_a8;
  long local_a0;
  undefined1 local_98 [16];
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = (directory->_M_dataplus)._M_p;
  local_a8 = local_98;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_a8,pcVar2,pcVar2 + directory->_M_string_length);
  __n = (this->Watch->super_Watcher).Directory._M_string_length;
  sVar3 = directory->_M_string_length;
  if ((__n == sVar3) &&
     ((__n == 0 ||
      (iVar5 = bcmp((this->Watch->super_Watcher).Directory._M_dataplus._M_p,
                    (directory->_M_dataplus)._M_p,__n), iVar5 == 0)))) goto LAB_001102ac;
  if (sVar3 == 0) {
    pDVar6 = this->Parent;
    if (pDVar6 == (DirWatcherGeneric *)0x0) goto LAB_001102ac;
  }
  else {
    cVar1 = *(directory->_M_dataplus)._M_p;
    cVar4 = FileSystem::getOSSlash();
    if (cVar1 == cVar4) goto LAB_001102ac;
    lVar7 = directory->_M_string_length - 1;
    if (directory->_M_string_length == 0) {
      std::__throw_out_of_range_fmt
                ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",lVar7,0);
    }
    cVar1 = (directory->_M_dataplus)._M_p[lVar7];
    cVar4 = FileSystem::getOSSlash();
    pDVar6 = this->Parent;
    if (pDVar6 == (DirWatcherGeneric *)0x0 || cVar1 == cVar4) goto LAB_001102ac;
  }
  pcVar2 = (pDVar6->DirSnap).DirectoryInfo.Filepath._M_dataplus._M_p;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,pcVar2,
             pcVar2 + (pDVar6->DirSnap).DirectoryInfo.Filepath._M_string_length);
  FileSystem::dirAddSlashAtEnd(&local_88);
  FileSystem::dirAddSlashAtEnd(directory);
  std::operator+(&local_48,&local_88,directory);
  std::__cxx11::string::operator=((string *)&local_a8,(string *)&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
LAB_001102ac:
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_68,local_a8,local_a8 + local_a0);
  DirectorySnapshot::setDirectoryInfo(&this->DirSnap,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  if (local_a8 != local_98) {
    operator_delete(local_a8);
  }
  return;
}

Assistant:

void DirWatcherGeneric::resetDirectory( std::string directory ) {
	std::string dir( directory );

	/// Is this a recursive watch?
	if ( Watch->Directory != directory ) {
		if ( !( directory.size() &&
				( directory.at( 0 ) == FileSystem::getOSSlash() ||
				  directory.at( directory.size() - 1 ) == FileSystem::getOSSlash() ) ) ) {
			/// Get the real directory
			if ( NULL != Parent ) {
				std::string parentPath( Parent->DirSnap.DirectoryInfo.Filepath );
				FileSystem::dirAddSlashAtEnd( parentPath );
				FileSystem::dirAddSlashAtEnd( directory );

				dir = parentPath + directory;
			} else {
				efDEBUG( "resetDirectory(): Parent is NULL. Fatal error." );
			}
		}
	}

	DirSnap.setDirectoryInfo( dir );
}